

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O2

void __thiscall duckdb::WKBColumnWriterState::~WKBColumnWriterState(WKBColumnWriterState *this)

{
  GeoParquetColumnMetadataWriter::~GeoParquetColumnMetadataWriter(&this->geo_data_writer);
  GeoParquetColumnMetadata::~GeoParquetColumnMetadata(&this->geo_data);
  StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetCastOperator>::
  ~StandardColumnWriterState
            (&this->
              super_StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetCastOperator>
            );
  return;
}

Assistant:

WKBColumnWriterState(ParquetWriter &writer, duckdb_parquet::RowGroup &row_group, idx_t col_idx)
	    : StandardColumnWriterState(writer, row_group, col_idx), geo_data(), geo_data_writer(writer.GetContext()) {
	}